

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

void __thiscall EmmyFacade::OnLuaStateGC(EmmyFacade *this,lua_State *L)

{
  bool bVar1;
  shared_ptr<Debugger> debugger;
  Debugger *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  EmmyDebuggerManager::RemoveDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffd8,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_28 != (Debugger *)0x0) {
    Debugger::Detach(local_28);
  }
  if (this->workMode == EmmyCore) {
    bVar1 = EmmyDebuggerManager::IsDebuggerEmpty(&this->_emmyDebuggerManager);
    if (bVar1) {
      Destroy(this);
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return;
}

Assistant:

void EmmyFacade::OnLuaStateGC(lua_State *L) {
	auto debugger = _emmyDebuggerManager.RemoveDebugger(L);

	if (debugger) {
		debugger->Detach();
	}

	if (workMode == WorkMode::EmmyCore) {
		if (_emmyDebuggerManager.IsDebuggerEmpty()) {
			Destroy();
		}
	}
}